

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common-test.c++
# Opt level: O2

void __thiscall kj::parse::anon_unknown_0::TestCase189::run(TestCase189 *this)

{
  Maybe<int> result;
  Sequence_<kj::parse::Exactly_<char>,_kj::parse::Many_<kj::parse::Exactly_<char>,_false>_> parser;
  AddFailureAdapter local_50;
  Input input;
  
  parser.rest._1_1_ = 0;
  parser.first.expected = 'f';
  parser.rest.first.subParser.expected = (Exactly_<char>)0x6f;
  input.parent = (IteratorInput<char,_const_char_*> *)0x0;
  input.pos = "foooob";
  input.end = "oob";
  input.best = "foooob";
  Sequence_<kj::parse::Exactly_<char>,_kj::parse::Many_<kj::parse::Exactly_<char>,_false>_>::
  parseNext<kj::parse::IteratorInput<char,_const_char_*>_>
            ((Sequence_<kj::parse::Exactly_<char>,_kj::parse::Many_<kj::parse::Exactly_<char>,_false>_>
              *)&local_50,(IteratorInput<char,_const_char_*> *)&parser);
  result.ptr.isSet = false;
  if (local_50.handled == true) {
    result.ptr.field_1.value = local_50._4_4_;
    result.ptr.isSet = true;
    if ((local_50._4_4_ != 2) && (kj::_::Debug::minSeverity < 3)) {
      local_50._0_4_ = 2;
      kj::_::Debug::log<char_const(&)[29],int,int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
                 ,0xc6,ERROR,"\"failed: expected \" \"(2) == (*i)\", 2, *i",
                 (char (*) [29])"failed: expected (2) == (*i)",(int *)&local_50,
                 &result.ptr.field_1.value);
    }
  }
  else {
    local_50._0_4_ = local_50._0_4_ & 0xffffff00;
    local_50.file =
         "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
    ;
    local_50.line = 200;
    AddFailureAdapter::operator<<(&local_50,(char (*) [22])"Expected 2, got null.");
    AddFailureAdapter::~AddFailureAdapter(&local_50);
  }
  if ((input.pos != input.end) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[31]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
               ,0xca,ERROR,"\"failed: expected \" \"input.atEnd()\"",
               (char (*) [31])"failed: expected input.atEnd()");
  }
  IteratorInput<char,_const_char_*>::~IteratorInput(&input);
  input.parent = (IteratorInput<char,_const_char_*> *)0x0;
  input.pos = "foooob";
  input.end = "b";
  input.best = "foooob";
  Sequence_<kj::parse::Exactly_<char>,_kj::parse::Many_<kj::parse::Exactly_<char>,_false>_>::
  parseNext<kj::parse::IteratorInput<char,_const_char_*>_>
            ((Sequence_<kj::parse::Exactly_<char>,_kj::parse::Many_<kj::parse::Exactly_<char>,_false>_>
              *)&local_50,(IteratorInput<char,_const_char_*> *)&parser);
  result.ptr.isSet = false;
  if (local_50.handled == true) {
    result.ptr.field_1.value = local_50._4_4_;
    result.ptr.isSet = true;
    if ((local_50._4_4_ != 4) && (kj::_::Debug::minSeverity < 3)) {
      local_50._0_4_ = 4;
      kj::_::Debug::log<char_const(&)[29],int,int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
                 ,0xd1,ERROR,"\"failed: expected \" \"(4) == (*i)\", 4, *i",
                 (char (*) [29])"failed: expected (4) == (*i)",(int *)&local_50,
                 &result.ptr.field_1.value);
    }
  }
  else {
    local_50._0_4_ = local_50._0_4_ & 0xffffff00;
    local_50.file =
         "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
    ;
    local_50.line = 0xd3;
    AddFailureAdapter::operator<<(&local_50,(char (*) [22])"Expected 4, got null.");
    AddFailureAdapter::~AddFailureAdapter(&local_50);
  }
  if ((input.pos != input.end) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[31]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
               ,0xd5,ERROR,"\"failed: expected \" \"input.atEnd()\"",
               (char (*) [31])"failed: expected input.atEnd()");
  }
  IteratorInput<char,_const_char_*>::~IteratorInput(&input);
  input.parent = (IteratorInput<char,_const_char_*> *)0x0;
  input.pos = "foooob";
  input.end = "";
  input.best = "foooob";
  Sequence_<kj::parse::Exactly_<char>,_kj::parse::Many_<kj::parse::Exactly_<char>,_false>_>::
  parseNext<kj::parse::IteratorInput<char,_const_char_*>_>
            ((Sequence_<kj::parse::Exactly_<char>,_kj::parse::Many_<kj::parse::Exactly_<char>,_false>_>
              *)&local_50,(IteratorInput<char,_const_char_*> *)&parser);
  result.ptr.isSet = false;
  if (local_50.handled == true) {
    result.ptr.field_1.value = local_50._4_4_;
    result.ptr.isSet = true;
    if ((local_50._4_4_ != 4) && (kj::_::Debug::minSeverity < 3)) {
      local_50._0_4_ = 4;
      kj::_::Debug::log<char_const(&)[29],int,int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
                 ,0xdc,ERROR,"\"failed: expected \" \"(4) == (*i)\", 4, *i",
                 (char (*) [29])"failed: expected (4) == (*i)",(int *)&local_50,
                 &result.ptr.field_1.value);
    }
  }
  else {
    local_50._0_4_ = local_50._0_4_ & 0xffffff00;
    local_50.file =
         "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
    ;
    local_50.line = 0xde;
    AddFailureAdapter::operator<<(&local_50,(char (*) [22])"Expected 4, got null.");
    AddFailureAdapter::~AddFailureAdapter(&local_50);
  }
  if ((input.pos == input.end) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[34]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
               ,0xe0,ERROR,"\"failed: expected \" \"!(input.atEnd())\"",
               (char (*) [34])"failed: expected !(input.atEnd())");
  }
  IteratorInput<char,_const_char_*>::~IteratorInput(&input);
  return;
}

Assistant:

TEST(CommonParsers, ManyParserCountOnly) {
  StringPtr text = "foooob";

  auto parser = sequence(exactly('f'), many(exactly('o')));

  {
    Input input(text.begin(), text.begin() + 3);
    Maybe<int> result = parser(input);
    KJ_IF_MAYBE(i, result) {
      EXPECT_EQ(2, *i);
    } else {
      ADD_FAILURE() << "Expected 2, got null.";
    }
    EXPECT_TRUE(input.atEnd());
  }